

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inverse_fourier_transform.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a030::InverseFastFourierTransformWrapper::~InverseFastFourierTransformWrapper
          (InverseFastFourierTransformWrapper *this)

{
  InverseFastFourierTransformWrapper *in_RDI;
  
  ~InverseFastFourierTransformWrapper(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

~InverseFastFourierTransformWrapper() override {
  }